

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O2

bool __thiscall ON_Linetype::Write(ON_Linetype *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_UUID *uuid;
  ON_LinetypePrivate *pOVar4;
  ON_wString linetype_name;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar3 < 0x3c) {
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,1);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,&this->super_ON_ModelComponent);
    if (bVar1) {
      ON_wString::ON_wString(&linetype_name);
      ON_ModelComponent::GetName(&this->super_ON_ModelComponent,&linetype_name);
      bVar1 = ON_BinaryArchive::WriteString(file,&linetype_name);
      if ((bVar1) &&
         (bVar1 = ON_BinaryArchive::WriteArray(file,&this->m_private->m_segments), bVar1)) {
        uuid = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
        bVar1 = ON_BinaryArchive::WriteUuid(file,uuid);
      }
      else {
        bVar1 = false;
      }
      ON_wString::~ON_wString(&linetype_name);
      goto LAB_004e665d;
    }
  }
  else {
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,2,3);
    if (!bVar1) {
      return false;
    }
    bVar1 = ON_BinaryArchive::WriteModelComponentAttributes
                      (file,&this->super_ON_ModelComponent,0x78);
    if (((((bVar1) &&
          (bVar1 = ON_BinaryArchive::WriteArray(file,&this->m_private->m_segments), bVar1)) &&
         ((this->m_cap_style == Round ||
          ((bVar1 = ON_BinaryArchive::WriteChar(file,'\x01'), bVar1 &&
           (bVar1 = ON_BinaryArchive::WriteChar(file,this->m_cap_style), bVar1)))))) &&
        ((this->m_join_style == Round ||
         ((bVar1 = ON_BinaryArchive::WriteChar(file,'\x02'), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteChar(file,this->m_join_style), bVar1)))))) &&
       (((ABS(this->m_width + -1.0) <= 2.220446049250313e-16 ||
         ((bVar1 = ON_BinaryArchive::WriteChar(file,'\x03'), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_width), bVar1)))) &&
        ((this->m_width_units == None ||
         ((bVar1 = ON_BinaryArchive::WriteChar(file,'\x04'), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteChar(file,this->m_width_units), bVar1)))))))) {
      pOVar4 = this->m_private;
      if (0 < (pOVar4->m_taper_points).m_count) {
        bVar1 = ON_BinaryArchive::WriteChar(file,'\x05');
        if ((!bVar1) || (bVar1 = ON_BinaryArchive::WriteArray(file,&pOVar4->m_taper_points), !bVar1)
           ) goto LAB_004e664f;
        pOVar4 = this->m_private;
      }
      if ((pOVar4->m_always_model_distances != true) ||
         ((bVar1 = ON_BinaryArchive::WriteChar(file,'\x06'), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteBool(file,this->m_private->m_always_model_distances),
          bVar1)))) {
        bVar1 = ON_BinaryArchive::WriteChar(file,'\0');
        goto LAB_004e665d;
      }
    }
  }
LAB_004e664f:
  bVar1 = false;
LAB_004e665d:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_Linetype::Write( ON_BinaryArchive& file) const
{
  bool rc = false;
  if (file.Archive3dmVersion() < 60)
  {
    if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, 1, 1))
      return false;
    for (;;)
    {
      // chunk version 1.0 fields
      if (!file.Write3dmReferencedComponentIndex(*this))
        break;
        
      ON_wString linetype_name;
      GetName(linetype_name);
      if (!file.WriteString(linetype_name))
        break;

      if (!file.WriteArray(m_private->m_segments))
        break;

      // chunk version 1.1 fields
      if (!file.WriteUuid(Id()))
        break;

      rc = true;
      break;
    }
  }
  else
  {
    // 12 Aug 2021 S. Baer (RH-2285)
    // minor_version = 1: add cap and join styles to linetype
    // 29 Nov 2022 S. Baer (RH-7262)
    // minor_version = 2: add width, width units, and taper
    // 13 Feb 2024 S. Baer (RH-79551)
    // minor_version = 3: add AlwaysModelDistance
    const int minor_version = 3;
    if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, 2, minor_version))
      return false;
    for (;;)
    {
      // chunk version 1.0 fields
      if (!file.WriteModelComponentAttributes(*this,ON_ModelComponent::Attributes::BinaryArchiveAttributes))
        break;

      if (!file.WriteArray(m_private->m_segments))
        break;

      // Only write non-default values in a similar fashion as ON_3dmObjectAttributes
      if (m_cap_style != ON::LineCapStyle::Round)
      {
        const unsigned char itemType = ON_LinetypeTypeCodes::LineCap; // 1
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteChar((unsigned char)m_cap_style))
          break;
      }

      if (m_join_style != ON::LineJoinStyle::Round)
      {
        const unsigned char itemType = ON_LinetypeTypeCodes::LineJoin; // 2
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteChar((unsigned char)m_join_style))
          break;
      }

      if (fabs(Width() - 1.0) > ON_EPSILON)
      {
        const unsigned char itemType = ON_LinetypeTypeCodes::Width; // 3
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(Width()))
          break;
      }

      if (WidthUnits() != ON::LengthUnitSystem::None)
      {
        const unsigned char itemType = ON_LinetypeTypeCodes::WidthUnits; // 4
        if (!file.WriteChar(itemType))
          break;

        unsigned char units = (unsigned char)WidthUnits();
        if (!file.WriteChar(units))
          break;
      }

      const ON_SimpleArray<ON_2dPoint>* taper = TaperPoints();
      if (taper && taper->Count() > 0)
      {
        const unsigned char itemType = ON_LinetypeTypeCodes::Taper; // 5
        if (!file.WriteChar(itemType))
          break;

        if (!file.WriteArray(*taper))
          break;
      }

      if (AlwaysModelDistances() == true)
      {
        const unsigned char itemType = ON_LinetypeTypeCodes::AlwaysModelDistance; // 6
        if (!file.WriteChar(itemType))
          break;

        if (!file.WriteBool(AlwaysModelDistances()))
          break;
      }

      // 0 indicates end of new linetype attributes
      const unsigned char attributes_end = 0;
      if (!file.WriteChar(attributes_end))
        break;

      rc = true;
      break;
    }

  }
  if (!file.EndWrite3dmChunk())
    rc = false;
  return rc;
}